

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

Abc_Obj_t * Abc_SclFindCriticalCo(SC_Man *p,int *pfRise)

{
  float fVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  SC_Pair *pSVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  long lVar9;
  float fVar10;
  
  pVVar3 = p->pNtk->vPos;
  if (pVVar3->nSize < 1) {
    __assert_fail("Abc_NtkPoNum(p->pNtk) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.c"
                  ,0x39,"Abc_Obj_t *Abc_SclFindCriticalCo(SC_Man *, int *)");
  }
  pVVar4 = p->pNtk->vCos;
  if (0 < pVVar4->nSize) {
    ppvVar5 = pVVar4->pArray;
    pSVar6 = p->pTimes;
    fVar10 = 0.0;
    lVar9 = 0;
    pAVar8 = (Abc_Obj_t *)0x0;
    do {
      pAVar7 = (Abc_Obj_t *)ppvVar5[lVar9];
      uVar2 = pAVar7->Id;
      fVar1 = pSVar6[uVar2].rise;
      if (fVar10 < fVar1) {
        *pfRise = 1;
        pAVar8 = pAVar7;
        fVar10 = fVar1;
      }
      fVar1 = pSVar6[uVar2].fall;
      if (fVar10 < fVar1) {
        *pfRise = 0;
        pAVar8 = pAVar7;
        fVar10 = fVar1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar4->nSize);
    if ((fVar10 != 0.0) || (NAN(fVar10))) goto LAB_0047537f;
  }
  if (pVVar3->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pAVar8 = (Abc_Obj_t *)*pVVar3->pArray;
LAB_0047537f:
  if (pAVar8 != (Abc_Obj_t *)0x0) {
    return pAVar8;
  }
  __assert_fail("pPivot != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.c"
                ,0x42,"Abc_Obj_t *Abc_SclFindCriticalCo(SC_Man *, int *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Finding most critical objects.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Obj_t * Abc_SclFindCriticalCo( SC_Man * p, int * pfRise )
{
    Abc_Obj_t * pObj, * pPivot = NULL;
    float fMaxArr = 0;
    int i;
    assert( Abc_NtkPoNum(p->pNtk) > 0 );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
    {
        SC_Pair * pArr = Abc_SclObjTime( p, pObj );
        if ( fMaxArr < pArr->rise )  fMaxArr = pArr->rise, *pfRise = 1, pPivot = pObj;
        if ( fMaxArr < pArr->fall )  fMaxArr = pArr->fall, *pfRise = 0, pPivot = pObj;
    }
    if ( fMaxArr == 0 )
        pPivot = Abc_NtkPo(p->pNtk, 0);
    assert( pPivot != NULL );
    return pPivot;
}